

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::split_leaf(memory_tree *b,single_learner *base,uint32_t cn)

{
  v_array<memory_tree_ns::node> *this;
  uint64_t *puVar1;
  polyprediction *ppVar2;
  size_t sVar3;
  example *peVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  node *pnVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint32_t uVar12;
  ulong uVar13;
  uint *__ptr;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  uint32_t ec_pos;
  labels preds;
  labels multilabels;
  uint local_dc;
  undefined8 local_d8;
  long local_d0;
  label_t local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  v_array<memory_tree_ns::node> *local_a0;
  float *local_98;
  float *pfStack_90;
  float *local_88;
  size_t sStack_80;
  label_t local_78;
  wclass *pwStack_70;
  wclass *local_68;
  double dStack_60;
  double dStack_58;
  uint *local_50;
  uint *puStack_48;
  uint *local_40;
  size_t sStack_38;
  
  this = &b->nodes;
  local_c8.label = cn;
  local_d8 = (ulong)cn;
  local_d0 = local_d8 * 0x48;
  (b->nodes)._begin[local_d8].internal = 1;
  uVar14 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * -0x71c71c71c71c71c7;
  local_68 = (wclass *)0x0;
  local_78.label = 0;
  local_78.weight = 0.0;
  pwStack_70 = (wclass *)0x0;
  dStack_60 = 0.001;
  dStack_58 = 0.001;
  local_50 = (uint *)0x0;
  puStack_48 = (uint *)0x0;
  local_40 = (uint *)0x0;
  sStack_38 = 0;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&local_78);
  uVar15 = uVar14 & 0xffffffff;
  (b->nodes)._begin[uVar15].internal = -1;
  pnVar8 = (b->nodes)._begin;
  sVar3 = b->routers_used;
  b->routers_used = sVar3 + 1;
  pnVar8[uVar15].base_router = (uint32_t)sVar3;
  uVar13 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * -0x71c71c71c71c71c7;
  local_68 = (wclass *)0x0;
  local_78.label = 0;
  local_78.weight = 0.0;
  pwStack_70 = (wclass *)0x0;
  dStack_60 = 0.001;
  dStack_58 = 0.001;
  local_50 = (uint *)0x0;
  puStack_48 = (uint *)0x0;
  local_40 = (uint *)0x0;
  sStack_38 = 0;
  local_b0 = uVar14;
  local_a8 = uVar15;
  local_a0 = this;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&local_78);
  uVar14 = uVar13 & 0xffffffff;
  (b->nodes)._begin[uVar14].internal = -1;
  pnVar8 = (b->nodes)._begin;
  sVar3 = b->routers_used;
  b->routers_used = sVar3 + 1;
  pnVar8[uVar14].base_router = (uint32_t)sVar3;
  pnVar8 = (b->nodes)._begin;
  uVar9 = (ulong)(*(int *)((long)&pnVar8->depth + local_d0) + 1);
  local_c0 = uVar13;
  local_b8 = uVar14;
  if (b->max_depth < uVar9) {
    b->max_depth = uVar9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"depth ",6);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pnVar8 = (b->nodes)._begin;
  }
  uVar9 = local_d8;
  *(int *)((long)&pnVar8->left + local_d0) = (int)local_b0;
  *(int *)((long)&((b->nodes)._begin)->right + local_d0) = (int)local_c0;
  (b->nodes)._begin[uVar15].parent = local_c8.label;
  (b->nodes)._begin[uVar14].parent = local_c8.label;
  pnVar8 = (b->nodes)._begin;
  pnVar8[uVar15].depth = *(int *)((long)&pnVar8->depth + local_d0) + 1;
  pnVar8 = (b->nodes)._begin;
  pnVar8[uVar14].depth = *(int *)((long)&pnVar8->depth + local_d0) + 1;
  pnVar8 = (b->nodes)._begin;
  if (b->max_depth < (ulong)pnVar8[uVar15].depth) {
    b->max_depth = (ulong)pnVar8[uVar15].depth;
  }
  __ptr = pnVar8[local_d8].examples_index._begin;
  if (pnVar8[local_d8].examples_index._end != __ptr) {
    uVar15 = 0;
    do {
      local_dc = __ptr[uVar15];
      peVar4 = (b->examples)._begin[local_dc];
      if (b->oas == 0) {
        local_c8 = (peVar4->l).multi;
        local_d8 = CONCAT44(local_d8._4_4_,(peVar4->pred).multiclass);
      }
      else {
        local_78 = (peVar4->l).multi;
        pwStack_70 = (peVar4->l).cs.costs._end;
        local_68 = (peVar4->l).cs.costs.end_array;
        dStack_60 = (double)(peVar4->l).cs.costs.erase_count;
        local_98 = (peVar4->pred).scalars._begin;
        pfStack_90 = (peVar4->pred).scalars._end;
        local_88 = (peVar4->pred).scalars.end_array;
        sStack_80 = (peVar4->pred).scalars.erase_count;
        local_d8 = (ulong)local_d8._4_4_ << 0x20;
      }
      (peVar4->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
      (peVar4->l).simple.initial = 0.0;
      peVar4 = (b->examples)._begin[local_dc];
      uVar12 = (b->nodes)._begin[uVar9].base_router;
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar12);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar4);
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar12 * *(int *)(base + 0xe0));
      ppVar2 = &(b->examples)._begin[local_dc]->pred;
      bVar5 = ppVar2->scalar != 0.0;
      bVar6 = ppVar2->scalar <= 0.0;
      uVar14 = local_b8;
      if (bVar6 && bVar5) {
        uVar14 = local_a8;
      }
      uVar12 = (uint32_t)local_c0;
      if (bVar6 && bVar5) {
        uVar12 = (uint32_t)local_b0;
      }
      v_array<unsigned_int>::push_back(&(b->nodes)._begin[uVar14].examples_index,&local_dc);
      fVar16 = train_node(b,base,(b->examples)._begin[local_dc],uVar12);
      pnVar8 = (b->nodes)._begin;
      (&pnVar8[uVar14].nl)[0.0 <= fVar16] = (&pnVar8[uVar14].nl)[0.0 <= fVar16] + 1.0;
      uVar14 = (ulong)local_dc;
      peVar4 = (b->examples)._begin[uVar14];
      if (b->oas == 0) {
        (peVar4->l).multi = local_c8;
        ((b->examples)._begin[uVar14]->pred).multiclass = (uint32_t)local_d8;
      }
      else {
        (peVar4->pred).scalars.end_array = local_88;
        (peVar4->pred).scalars.erase_count = sStack_80;
        (peVar4->pred).scalars._begin = local_98;
        (peVar4->pred).scalars._end = pfStack_90;
        peVar4 = (b->examples)._begin[uVar14];
        (peVar4->l).cs.costs.end_array = local_68;
        (peVar4->l).cs.costs.erase_count = (size_t)dStack_60;
        (peVar4->l).multi = local_78;
        (peVar4->l).cs.costs._end = pwStack_70;
      }
      uVar15 = uVar15 + 1;
      pnVar8 = local_a0->_begin;
      __ptr = pnVar8[uVar9].examples_index._begin;
    } while (uVar15 < (ulong)((long)pnVar8[uVar9].examples_index._end - (long)__ptr >> 2));
  }
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  pnVar8[uVar9].examples_index._begin = (uint *)0x0;
  pnVar8[uVar9].examples_index._end = (uint *)0x0;
  pnVar8[uVar9].examples_index.end_array = (uint *)0x0;
  pnVar8 = (b->nodes)._begin;
  lVar10 = (long)pnVar8[local_a8].examples_index._end - (long)pnVar8[local_a8].examples_index._begin
  ;
  lVar11 = lVar10 >> 2;
  auVar17._8_4_ = (int)(lVar10 >> 0x22);
  auVar17._0_8_ = lVar11;
  auVar17._12_4_ = 0x45300000;
  dVar18 = (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  dVar21 = 0.001;
  if (0.001 <= dVar18) {
    dVar21 = dVar18;
  }
  *(double *)((long)&pnVar8->nl + local_d0) = dVar21;
  pnVar8 = (b->nodes)._begin;
  lVar10 = (long)pnVar8[local_b8].examples_index._end - (long)pnVar8[local_b8].examples_index._begin
  ;
  lVar11 = lVar10 >> 2;
  auVar19._8_4_ = (int)(lVar10 >> 0x22);
  auVar19._0_8_ = lVar11;
  auVar19._12_4_ = 0x45300000;
  dVar18 = (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  dVar21 = 0.001;
  if (0.001 <= dVar18) {
    dVar21 = dVar18;
  }
  *(double *)((long)&pnVar8->nr + local_d0) = dVar21;
  pnVar8 = (b->nodes)._begin;
  dVar18 = *(double *)((long)&pnVar8->nr + local_d0);
  dVar21 = *(double *)((long)&pnVar8->nl + local_d0);
  if (dVar18 <= dVar21) {
    dVar18 = dVar21;
  }
  sVar3 = b->max_ex_in_leaf;
  auVar20._8_4_ = (int)(sVar3 >> 0x20);
  auVar20._0_8_ = sVar3;
  auVar20._12_4_ = 0x45300000;
  if ((auVar20._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) < dVar18) {
    b->max_ex_in_leaf = (long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18
    ;
  }
  return;
}

Assistant:

void split_leaf(memory_tree& b, single_learner& base, const uint32_t cn)
    {
        //create two children
        b.nodes[cn].internal = 1; //swith to internal node.
        uint32_t left_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());
        b.nodes[left_child].internal = -1;  //left leaf
        b.nodes[left_child].base_router = (b.routers_used++);
        uint32_t right_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());  
        b.nodes[right_child].internal = -1;  //right leaf
        b.nodes[right_child].base_router = (b.routers_used++); 

        if (b.nodes[cn].depth + 1 > b.max_depth){
            b.max_depth = b.nodes[cn].depth + 1;
            cout<<"depth "<<b.max_depth<<endl;
        }

        b.nodes[cn].left = left_child;
        b.nodes[cn].right = right_child;
        b.nodes[left_child].parent = cn;
        b.nodes[right_child].parent = cn;
        b.nodes[left_child].depth = b.nodes[cn].depth + 1;
        b.nodes[right_child].depth = b.nodes[cn].depth + 1;

        if (b.nodes[left_child].depth > b.max_depth)
            b.max_depth = b.nodes[left_child].depth;

        //rout the examples stored in the node to the left and right
        for(size_t ec_id = 0; ec_id < b.nodes[cn].examples_index.size(); ec_id++) //scan all examples stored in the cn
        {
            uint32_t ec_pos = b.nodes[cn].examples_index[ec_id];
            MULTICLASS::label_t mc;
            uint32_t save_multi_pred = 0;
            MULTILABEL::labels multilabels;
            MULTILABEL::labels preds;
            if (b.oas == false){
                mc = b.examples[ec_pos]->l.multi;
                save_multi_pred = b.examples[ec_pos]->pred.multiclass;
            }
            else{
                multilabels = b.examples[ec_pos]->l.multilabels;
                preds = b.examples[ec_pos]->pred.multilabels;
            }

            b.examples[ec_pos]->l.simple = {1.f, 1.f, 0.f};
            base.predict(*b.examples[ec_pos], b.nodes[cn].base_router); //re-predict
            float scalar = b.examples[ec_pos]->pred.scalar; //this is spliting the leaf. 
            if (scalar < 0)
            {
                b.nodes[left_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], left_child);
                insert_descent(b.nodes[left_child], leaf_pred); //fake descent, only for update nl and nr                
            }
            else
            {
                b.nodes[right_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], right_child);
                insert_descent(b.nodes[right_child], leaf_pred); //fake descent. for update nr and nl
            }

            if(b.oas == false){
                b.examples[ec_pos]->l.multi = mc;
                b.examples[ec_pos]->pred.multiclass = save_multi_pred;
            }
            else{
                b.examples[ec_pos]->pred.multilabels = preds;
                b.examples[ec_pos]->l.multilabels = multilabels;
            }
        }
        b.nodes[cn].examples_index.delete_v(); //empty the cn's example list
        b.nodes[cn].nl = (std::max)(double(b.nodes[left_child].examples_index.size()), 0.001); //avoid to set nl to zero
        b.nodes[cn].nr = (std::max)(double(b.nodes[right_child].examples_index.size()), 0.001); //avoid to set nr to zero

        if ((std::max)(b.nodes[cn].nl, b.nodes[cn].nr) > b.max_ex_in_leaf)
        {
            b.max_ex_in_leaf = (std::max)(b.nodes[cn].nl, b.nodes[cn].nr);
            //cout<<b.max_ex_in_leaf<<endl;
        }
    }